

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error tt_set_mm_blend(TT_Face face,FT_UInt num_coords,FT_Fixed *coords,FT_Bool set_design_coords)

{
  FT_Stream stream;
  GX_AVarCorrespondence pGVar1;
  long lVar2;
  bool bVar3;
  FT_UShort FVar4;
  FT_UInt FVar5;
  FT_Fixed *pFVar6;
  FT_ULong FVar7;
  ulong uVar8;
  FT_Long FVar9;
  FT_Fixed *pFVar10;
  FT_ULong *pFVar11;
  undefined7 in_register_00000009;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  GX_Blend pGVar18;
  ulong uVar19;
  FT_Memory pFVar20;
  GX_AVarSegment av;
  ulong uVar21;
  GX_AVarSegment pGVar22;
  FT_Error error_1;
  FT_Error error;
  FT_ULong table_len;
  FT_Error local_b0;
  FT_Error local_ac;
  GX_Blend local_a8;
  uint local_9c;
  undefined8 local_98;
  GX_Blend local_90;
  FT_Memory local_88;
  FT_Memory local_80;
  long local_78;
  FT_ULong local_70;
  long local_68;
  ushort local_60;
  ushort local_5e;
  long local_58;
  ushort local_50;
  byte local_4e;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  uVar8 = CONCAT71(in_register_00000009,set_design_coords) & 0xffffffff;
  uVar17 = (ulong)num_coords;
  local_ac = 0;
  pFVar20 = (face->root).memory;
  face->doblend = '\0';
  if ((face->blend == (GX_Blend)0x0) &&
     (local_ac = TT_Get_MM_Var(face,(FT_MM_Var **)0x0), local_ac != 0)) {
    return local_ac;
  }
  local_a8 = face->blend;
  local_90 = (GX_Blend)local_a8->mmvar;
  uVar15 = ((FT_MM_Var *)local_90)->num_axis;
  uVar13 = (ulong)uVar15;
  uVar21 = uVar17;
  if (uVar15 < num_coords) {
    uVar21 = (ulong)uVar15;
  }
  if ((int)uVar21 != 0) {
    FVar5 = num_coords;
    if (uVar13 < uVar17) {
      FVar5 = uVar15;
    }
    lVar12 = 0;
    do {
      if (coords[lVar12] - 0x10001U < 0xfffffffffffdffff) {
        return 6;
      }
      lVar12 = lVar12 + 1;
    } while (FVar5 != (uint)lVar12);
  }
  pGVar18 = local_90;
  if ((face->is_cff2 != '\0') || (local_a8->glyphoffsets != (FT_ULong *)0x0)) goto LAB_0016de57;
  stream = (face->root).stream;
  local_88 = stream->memory;
  local_98 = uVar21;
  local_80 = pFVar20;
  local_40 = uVar13;
  local_b0 = (*face->goto_table)(face,0x67766172,stream,&local_38);
  if (local_b0 == 0) {
    FVar7 = FT_Stream_Pos(stream);
    local_b0 = FT_Stream_ReadFields(stream,(FT_Frame_Field *)ft_var_load_gvar_gvar_fields,&local_68)
    ;
    pGVar18 = local_a8;
    if (local_b0 == 0) {
      local_70 = FVar7;
      if ((((local_68 == 0x10000) && (local_60 == (ushort)local_a8->mmvar->num_axis)) &&
          ((ulong)local_60 * (ulong)local_5e < local_38 >> 1 ||
           (ulong)local_60 * (ulong)local_5e - (local_38 >> 1) == 0)) &&
         ((ulong)local_50 << (local_4e & 1) + 1 <= local_38)) {
        local_a8->gvar_size = local_38;
        local_a8->tuplecount = (uint)local_5e;
        local_a8->gv_glyphcnt = (uint)local_50;
        local_78 = local_48 + FVar7;
        local_9c = (uint)CONCAT71(in_register_00000009,set_design_coords);
        pFVar11 = (FT_ULong *)ft_mem_realloc(local_88,8,0,(ulong)local_50 + 1,(void *)0x0,&local_b0)
        ;
        pGVar18->glyphoffsets = pFVar11;
        uVar8 = (ulong)local_9c;
        if (local_b0 == 0) {
          uVar13 = (ulong)(local_a8->gv_glyphcnt + 1);
          if ((local_4e & 1) == 0) {
            local_b0 = FT_Stream_EnterFrame(stream,uVar13 * 2);
            pGVar18 = local_a8;
            if (local_b0 == 0) {
              uVar15 = 0;
              do {
                FVar4 = FT_Stream_GetUShort(stream);
                pGVar18->glyphoffsets[uVar15] = local_78 + (ulong)FVar4 * 2;
                uVar15 = uVar15 + 1;
              } while (uVar15 <= pGVar18->gv_glyphcnt);
LAB_0016e47f:
              FT_Stream_ExitFrame(stream);
              FVar7 = local_70;
              uVar8 = (ulong)local_9c;
              if (pGVar18->tuplecount != 0) {
                pFVar6 = (FT_Fixed *)
                         ft_mem_realloc(local_88,8,0,(ulong)(pGVar18->tuplecount * (uint)local_60),
                                        (void *)0x0,&local_b0);
                local_a8->tuplecoords = pFVar6;
                if (((local_b0 == 0) &&
                    (local_b0 = FT_Stream_Seek(stream,FVar7 + local_58), local_b0 == 0)) &&
                   (local_b0 = FT_Stream_EnterFrame
                                         (stream,(ulong)((uint)local_60 * local_a8->tuplecount) * 2)
                   , pGVar18 = local_a8, local_b0 == 0)) {
                  local_88 = (FT_Memory)CONCAT44(local_88._4_4_,num_coords);
                  if (local_a8->tuplecount != 0) {
                    uVar15 = 0;
                    do {
                      if (local_60 != 0) {
                        uVar16 = 0;
                        do {
                          FVar4 = FT_Stream_GetUShort(stream);
                          pGVar18->tuplecoords[uVar15 * local_60 + uVar16] =
                               (long)((int)(short)FVar4 << 2);
                          uVar16 = uVar16 + 1;
                        } while (uVar16 < local_60);
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < pGVar18->tuplecount);
                  }
                  FT_Stream_ExitFrame(stream);
                  uVar8 = (ulong)local_9c;
                  uVar17 = (ulong)local_88 & 0xffffffff;
                }
              }
            }
          }
          else {
            local_b0 = FT_Stream_EnterFrame(stream,uVar13 << 2);
            pGVar18 = local_a8;
            if (local_b0 == 0) {
              uVar8 = 0;
              do {
                FVar7 = FT_Stream_GetULong(stream);
                pGVar18->glyphoffsets[uVar8] = FVar7 + local_78;
                uVar15 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar15;
              } while (uVar15 <= pGVar18->gv_glyphcnt);
              goto LAB_0016e47f;
            }
          }
        }
      }
      else {
        local_b0 = 8;
      }
    }
  }
  local_ac = local_b0;
  uVar13 = local_40;
  pGVar18 = local_90;
  pFVar20 = local_80;
  uVar21 = local_98;
  if (local_b0 != 0) {
    return local_b0;
  }
LAB_0016de57:
  local_90 = (GX_Blend)local_a8->coords;
  if (local_90 == (GX_Blend)0x0) {
    local_9c = (uint)uVar8;
    local_98 = uVar21;
    pFVar6 = (FT_Fixed *)
             ft_mem_realloc(pFVar20,8,0,(ulong)((FT_MM_Var *)pGVar18)->num_axis,(void *)0x0,
                            &local_ac);
    local_a8->coords = pFVar6;
    uVar8 = (ulong)local_9c;
    uVar21 = local_98;
    if (local_ac != 0) {
      return local_ac;
    }
  }
  pFVar6 = local_a8->normalizedcoords;
  FVar5 = (FT_UInt)uVar21;
  if (pFVar6 == (FT_Fixed *)0x0) {
    pFVar6 = (FT_Fixed *)
             ft_mem_realloc(pFVar20,8,0,(ulong)((FT_MM_Var *)pGVar18)->num_axis,(void *)0x0,
                            &local_ac);
    local_a8->normalizedcoords = pFVar6;
    if (local_ac != 0) {
      return local_ac;
    }
    local_98 = CONCAT44(local_98._4_4_,1);
  }
  else {
    if (FVar5 == 0) {
      uVar13 = 0;
      uVar17 = (ulong)local_98._4_4_;
    }
    else {
      if (uVar13 < uVar17) {
        uVar17 = uVar13;
      }
      uVar13 = 0;
      do {
        if (pFVar6[uVar13] != coords[uVar13]) {
          bVar3 = true;
          local_98 = CONCAT44(local_98._4_4_,2);
          goto LAB_0016e0a2;
        }
        uVar13 = uVar13 + 1;
      } while ((int)uVar17 != (int)uVar13);
      uVar17 = local_98 >> 0x20;
      uVar13 = uVar21 & 0xffffffff;
    }
    local_98 = uVar17 << 0x20;
    bVar3 = false;
LAB_0016e0a2:
    uVar17 = (face->root).face_index;
    uVar15 = ((FT_MM_Var *)pGVar18)->num_axis;
    uVar16 = (uint)uVar13;
    if ((uVar17 & 0x7fff0000) == 0) {
      if (uVar16 < uVar15) {
        uVar17 = uVar13 & 0xffffffff;
        do {
          if (pFVar6[uVar17] != 0) {
            bVar3 = true;
          }
          uVar17 = uVar17 + 1;
        } while (uVar15 != (uint)uVar17);
      }
    }
    else if (uVar16 < uVar15) {
      uVar19 = uVar13 & 0xffffffff;
      do {
        if (pFVar6[uVar19] !=
            local_a8->normalized_stylecoords[((uint)uVar17 >> 0x10) * uVar15 + uVar19]) {
          bVar3 = true;
        }
        uVar19 = uVar19 + 1;
      } while (uVar15 != (uint)uVar19);
    }
    if ((bVar3) && (uVar16 < ((FT_MM_Var *)pGVar18)->num_axis)) {
      lVar12 = 0;
      do {
        if (pFVar6[(uVar13 & 0xffffffff) + lVar12] != 0) {
          local_98 = CONCAT44(local_98._4_4_,2);
          break;
        }
        lVar12 = lVar12 + 1;
      } while (((FT_MM_Var *)pGVar18)->num_axis - uVar16 != (int)lVar12);
    }
    if (!bVar3) {
      return -1;
    }
  }
  local_a8->num_axis = ((FT_MM_Var *)pGVar18)->num_axis;
  local_80 = pFVar20;
  memcpy(local_a8->normalizedcoords,coords,(uVar21 & 0xffffffff) << 3);
  if ((char)uVar8 != '\0') {
    if (local_90 == (GX_Blend)0x0) {
      FVar5 = local_a8->num_axis;
    }
    pFVar6 = local_a8->coords;
    pGVar18 = face->blend;
    uVar15 = pGVar18->num_axis;
    if (FVar5 <= pGVar18->num_axis) {
      uVar15 = FVar5;
    }
    uVar17 = (ulong)uVar15;
    if (uVar15 == 0) {
      uVar8 = 0;
    }
    else {
      pFVar10 = local_a8->normalizedcoords;
      uVar8 = 0;
      do {
        pFVar6[uVar8] = pFVar10[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar17 != uVar8);
    }
    if ((uint)uVar8 < FVar5) {
      memset(pFVar6 + (uVar8 & 0xffffffff),0,(ulong)(FVar5 + ~(uint)uVar8) * 8 + 8);
    }
    pGVar22 = pGVar18->avar_segment;
    local_a8 = (GX_Blend)CONCAT44(local_a8._4_4_,uVar15);
    local_90 = pGVar18;
    if (uVar15 != 0 && pGVar22 != (GX_AVarSegment)0x0) {
      uVar8 = 0;
      do {
        if (1 < pGVar22->pairCount) {
          pGVar1 = pGVar22->correspondence;
          lVar12 = 0;
          do {
            lVar14 = *(long *)((long)&pGVar1[1].toCoord + lVar12);
            if (pFVar6[uVar8] < lVar14) {
              lVar2 = *(long *)((long)&pGVar1->toCoord + lVar12);
              FVar9 = FT_MulDiv(pFVar6[uVar8] - lVar2,
                                *(long *)((long)&pGVar1[1].fromCoord + lVar12) -
                                *(long *)((long)&pGVar1->fromCoord + lVar12),lVar14 - lVar2);
              pFVar6[uVar8] = FVar9 + *(long *)((long)&pGVar22->correspondence->fromCoord + lVar12);
              break;
            }
            lVar12 = lVar12 + 0x10;
          } while ((ulong)pGVar22->pairCount * 0x10 + -0x10 != lVar12);
        }
        uVar8 = uVar8 + 1;
        pGVar22 = pGVar22 + 1;
      } while (uVar8 != uVar17);
    }
    if ((int)local_a8 != 0) {
      pFVar10 = &local_90->mmvar->axis->maximum;
      uVar8 = 0;
      do {
        lVar12 = pFVar6[uVar8];
        if (lVar12 < 0) {
          lVar12 = (long)((int)pFVar10[-1] - (int)pFVar10[-2]) * (long)(int)lVar12;
          lVar14 = (long)(int)((ulong)((lVar12 >> 0x3f) + lVar12 + 0x8000) >> 0x10) + pFVar10[-1];
        }
        else {
          lVar14 = pFVar10[-1];
          if (lVar12 != 0) {
            lVar12 = (long)((int)*pFVar10 - (int)lVar14) * (long)(int)lVar12;
            lVar14 = lVar14 + (int)((ulong)((lVar12 >> 0x3f) + lVar12 + 0x8000) >> 0x10);
          }
        }
        pFVar6[uVar8] = lVar14;
        uVar8 = uVar8 + 1;
        pFVar10 = pFVar10 + 6;
      } while (uVar17 != uVar8);
    }
  }
  pFVar20 = local_80;
  face->doblend = '\x01';
  if (face->cvt != (FT_Short *)0x0) {
    if ((int)local_98 == 1) {
      local_ac = tt_face_vary_cvt(face,(face->root).stream);
    }
    else if ((int)local_98 == 2) {
      ft_mem_free(local_80,face->cvt);
      face->cvt = (FT_Short *)0x0;
      local_ac = tt_face_load_cvt(face,(face->root).stream);
    }
  }
  ft_mem_free(pFVar20,face->postscript_name);
  face->postscript_name = (char *)0x0;
  return local_ac;
}

Assistant:

static FT_Error
  tt_set_mm_blend( TT_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords,
                   FT_Bool    set_design_coords )
  {
    FT_Error    error = FT_Err_Ok;
    GX_Blend    blend;
    FT_MM_Var*  mmvar;
    FT_UInt     i;

    FT_Bool     all_design_coords = FALSE;

    FT_Memory   memory = face->root.memory;

    enum
    {
      mcvt_retain,
      mcvt_modify,
      mcvt_load

    } manageCvt;


    face->doblend = FALSE;

    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "TT_Set_MM_Blend:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    FT_TRACE5(( "normalized design coordinates:\n" ));

    for ( i = 0; i < num_coords; i++ )
    {
      FT_TRACE5(( "  %.5f\n", coords[i] / 65536.0 ));
      if ( coords[i] < -0x00010000L || coords[i] > 0x00010000L )
      {
        FT_TRACE1(( "TT_Set_MM_Blend: normalized design coordinate %.5f\n"
                    "                 is out of range [-1;1]\n",
                    coords[i] / 65536.0 ));
        error = FT_THROW( Invalid_Argument );
        goto Exit;
      }
    }

    FT_TRACE5(( "\n" ));

    if ( !face->is_cff2 && !blend->glyphoffsets )
      if ( FT_SET_ERROR( ft_var_load_gvar( face ) ) )
        goto Exit;

    if ( !blend->coords )
    {
      if ( FT_NEW_ARRAY( blend->coords, mmvar->num_axis ) )
        goto Exit;

      /* the first time we have to compute all design coordinates */
      all_design_coords = TRUE;
    }

    if ( !blend->normalizedcoords )
    {
      if ( FT_NEW_ARRAY( blend->normalizedcoords, mmvar->num_axis ) )
        goto Exit;

      manageCvt = mcvt_modify;

      /* If we have not set the blend coordinates before this, then the  */
      /* cvt table will still be what we read from the `cvt ' table and  */
      /* we don't need to reload it.  We may need to change it though... */
    }
    else
    {
      FT_Bool    have_diff = 0;
      FT_UInt    j;
      FT_Fixed*  c;
      FT_Fixed*  n;


      manageCvt = mcvt_retain;

      for ( i = 0; i < num_coords; i++ )
      {
        if ( blend->normalizedcoords[i] != coords[i] )
        {
          manageCvt = mcvt_load;
          have_diff = 1;
          break;
        }
      }

      if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) )
      {
        FT_UInt  idx = (FT_UInt)face->root.face_index >> 16;


        c = blend->normalizedcoords + i;
        n = blend->normalized_stylecoords + idx * mmvar->num_axis + i;
        for ( j = i; j < mmvar->num_axis; j++, n++, c++ )
          if ( *c != *n )
            have_diff = 1;
      }
      else
      {
        c = blend->normalizedcoords + i;
        for ( j = i; j < mmvar->num_axis; j++, c++ )
          if ( *c != 0 )
            have_diff = 1;
      }

      /* return value -1 indicates `no change' */
      if ( !have_diff )
        return -1;

      for ( ; i < mmvar->num_axis; i++ )
      {
        if ( blend->normalizedcoords[i] != 0 )
        {
          manageCvt = mcvt_load;
          break;
        }
      }

      /* If we don't change the blend coords then we don't need to do  */
      /* anything to the cvt table.  It will be correct.  Otherwise we */
      /* no longer have the original cvt (it was modified when we set  */
      /* the blend last time), so we must reload and then modify it.   */
    }

    blend->num_axis = mmvar->num_axis;
    FT_MEM_COPY( blend->normalizedcoords,
                 coords,
                 num_coords * sizeof ( FT_Fixed ) );

    if ( set_design_coords )
      ft_var_to_design( face,
                        all_design_coords ? blend->num_axis : num_coords,
                        blend->normalizedcoords,
                        blend->coords );

    face->doblend = TRUE;

    if ( face->cvt )
    {
      switch ( manageCvt )
      {
      case mcvt_load:
        /* The cvt table has been loaded already; every time we change the */
        /* blend we may need to reload and remodify the cvt table.         */
        FT_FREE( face->cvt );
        face->cvt = NULL;

        error = tt_face_load_cvt( face, face->root.stream );
        break;

      case mcvt_modify:
        /* The original cvt table is in memory.  All we need to do is */
        /* apply the `cvar' table (if any).                           */
        error = tt_face_vary_cvt( face, face->root.stream );
        break;

      case mcvt_retain:
        /* The cvt table is correct for this set of coordinates. */
        break;
      }
    }

    /* enforce recomputation of the PostScript name; */
    FT_FREE( face->postscript_name );
    face->postscript_name = NULL;

  Exit:
    return error;
  }